

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall
ON_Xform::DecomposeAffine(ON_Xform *this,ON_3dVector *T,ON_Xform *R,ON_Xform *Q,ON_3dVector *lambda)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double *pdVar7;
  long lVar8;
  ON_Xform *pOVar9;
  ON_3dVector *pOVar10;
  ON_Xform *pOVar11;
  byte bVar12;
  double dVar13;
  ON_Xform L;
  ON_Xform Diag;
  ON_Xform QT;
  ON_Xform LTL;
  ON_Xform LT;
  ON_3dVector local_3b0 [5];
  ON_Xform local_330;
  ON_Xform local_2b0;
  ON_Xform local_230;
  ON_Xform local_1b0;
  ON_Xform local_130;
  ON_Xform local_b0;
  
  bVar12 = 0;
  bVar6 = IsAffine(this);
  if (bVar6) {
    ON_Xform(&local_2b0);
    DecomposeAffine(this,T,&local_2b0);
    pOVar9 = &local_2b0;
    pOVar11 = &local_b0;
    for (lVar8 = 0x10; dVar5 = local_b0.m_xform[2][3], dVar4 = local_b0.m_xform[1][3],
        dVar3 = local_b0.m_xform[1][2], dVar2 = local_b0.m_xform[0][3],
        dVar1 = local_b0.m_xform[0][2], dVar13 = local_b0.m_xform[0][1], lVar8 != 0;
        lVar8 = lVar8 + -1) {
      pOVar11->m_xform[0][0] = pOVar9->m_xform[0][0];
      pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar12 * -2 + 1) * 8);
    }
    local_b0.m_xform[0][1] = local_b0.m_xform[1][0];
    local_b0.m_xform[1][0] = dVar13;
    local_b0.m_xform[0][2] = local_b0.m_xform[2][0];
    local_b0.m_xform[2][0] = dVar1;
    local_b0.m_xform[0][3] = local_b0.m_xform[3][0];
    local_b0.m_xform[3][0] = dVar2;
    local_b0.m_xform[1][2] = local_b0.m_xform[2][1];
    local_b0.m_xform[2][1] = dVar3;
    local_b0.m_xform[1][3] = local_b0.m_xform[3][1];
    local_b0.m_xform[3][1] = dVar4;
    local_b0.m_xform[2][3] = local_b0.m_xform[3][2];
    local_b0.m_xform[3][2] = dVar5;
    operator*(&local_130,&local_b0,&local_2b0);
    bVar6 = DecomposeSymmetric(&local_130,Q,lambda);
    if (bVar6) {
      bVar6 = false;
      pdVar7 = ON_3dVector::operator[](lambda,0);
      if (0.0 < *pdVar7) {
        pdVar7 = ON_3dVector::operator[](lambda,1);
        if (*pdVar7 <= 0.0) {
          bVar6 = false;
        }
        else {
          pdVar7 = ON_3dVector::operator[](lambda,2);
          bVar6 = 0.0 < *pdVar7;
        }
      }
      if (bVar6 != false) {
        pdVar7 = ON_3dVector::operator[](lambda,0);
        dVar13 = *pdVar7;
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        pdVar7 = ON_3dVector::operator[](lambda,0);
        *pdVar7 = dVar13;
        pdVar7 = ON_3dVector::operator[](lambda,1);
        dVar13 = *pdVar7;
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        pdVar7 = ON_3dVector::operator[](lambda,1);
        *pdVar7 = dVar13;
        pdVar7 = ON_3dVector::operator[](lambda,2);
        dVar13 = *pdVar7;
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        pdVar7 = ON_3dVector::operator[](lambda,2);
        *pdVar7 = dVar13;
        pOVar9 = Q;
        pOVar11 = &local_1b0;
        for (lVar8 = 0x10; dVar5 = local_1b0.m_xform[2][3], dVar4 = local_1b0.m_xform[1][3],
            dVar3 = local_1b0.m_xform[1][2], dVar2 = local_1b0.m_xform[0][3],
            dVar1 = local_1b0.m_xform[0][2], dVar13 = local_1b0.m_xform[0][1], lVar8 != 0;
            lVar8 = lVar8 + -1) {
          pOVar11->m_xform[0][0] = pOVar9->m_xform[0][0];
          pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
          pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar12 * -2 + 1) * 8);
        }
        local_1b0.m_xform[0][1] = local_1b0.m_xform[1][0];
        local_1b0.m_xform[1][0] = dVar13;
        local_1b0.m_xform[0][2] = local_1b0.m_xform[2][0];
        local_1b0.m_xform[2][0] = dVar1;
        local_1b0.m_xform[0][3] = local_1b0.m_xform[3][0];
        local_1b0.m_xform[3][0] = dVar2;
        local_1b0.m_xform[1][2] = local_1b0.m_xform[2][1];
        local_1b0.m_xform[2][1] = dVar3;
        local_1b0.m_xform[1][3] = local_1b0.m_xform[3][1];
        local_1b0.m_xform[3][1] = dVar4;
        local_1b0.m_xform[2][3] = local_1b0.m_xform[3][2];
        local_1b0.m_xform[3][2] = dVar5;
        pdVar7 = ON_3dVector::operator[](lambda,0);
        dVar13 = *pdVar7;
        pdVar7 = ON_3dVector::operator[](lambda,1);
        dVar1 = *pdVar7;
        pdVar7 = ON_3dVector::operator[](lambda,2);
        dVar2 = *pdVar7;
        pOVar9 = &IdentityTransformation;
        pOVar11 = &local_230;
        for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
          pOVar11->m_xform[0][0] = pOVar9->m_xform[0][0];
          pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
          pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar12 * -2 + 1) * 8);
        }
        local_230.m_xform[0][0] = 1.0 / dVar13;
        local_230.m_xform[1][1] = 1.0 / dVar1;
        local_230.m_xform[2][2] = 1.0 / dVar2;
        operator*(&local_330,Q,&local_230);
        operator*((ON_Xform *)local_3b0,&local_330,&local_1b0);
        pOVar10 = local_3b0;
        pOVar9 = R;
        for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
          pOVar9->m_xform[0][0] = (*(double (*) [4])&pOVar10->x)[0];
          pOVar10 = (ON_3dVector *)((long)pOVar10 + ((ulong)bVar12 * -2 + 1) * 8);
          pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        }
        operator*((ON_Xform *)local_3b0,&local_2b0,R);
        pOVar10 = local_3b0;
        pOVar9 = R;
        for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
          pOVar9->m_xform[0][0] = (*(double (*) [4])&pOVar10->x)[0];
          pOVar10 = (ON_3dVector *)((long)pOVar10 + ((ulong)bVar12 * -2 + 1) * 8);
          pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        }
        dVar13 = Determinant(R,(double *)0x0);
        if (dVar13 < 0.0) {
          ON_Xform(&local_330,-1.0);
          operator*((ON_Xform *)local_3b0,&local_330,R);
          pOVar10 = local_3b0;
          pOVar9 = R;
          for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
            pOVar9->m_xform[0][0] = (*(double (*) [4])&pOVar10->x)[0];
            pOVar10 = (ON_3dVector *)((long)pOVar10 + ((ulong)bVar12 * -2 + 1) * 8);
            pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
          }
          ::operator*(local_3b0,-1,lambda);
          lambda->z = local_3b0[0].z;
          lambda->x = local_3b0[0].x;
          lambda->y = local_3b0[0].y;
        }
        Orthogonalize(R,2.3283064365386963e-10);
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ON_Xform::DecomposeAffine(ON_3dVector& T, ON_Xform& R,
	ON_Xform& Q, ON_3dVector& lambda) const
{
	bool rc = false;
	if (IsAffine())
	{
		ON_Xform L;
		DecomposeAffine(T, L);
		ON_Xform LT = L;
		LT.Transpose();
		ON_Xform LTL = LT * L;

		rc = LTL.DecomposeSymmetric(Q, lambda);
		if (rc)
		{
			rc = (lambda[0] > 0 && lambda[1] > 0 && lambda[2] > 0);
			if(rc)
			{
				lambda[0] = sqrt(lambda[0]);
				lambda[1] = sqrt(lambda[1]);
				lambda[2] = sqrt(lambda[2]);
				ON_Xform QT = Q;
				QT.Transpose();
				ON_Xform Diag = ON_Xform::DiagonalTransformation(1.0 / lambda[0], 1.0 / lambda[1], 1.0 / lambda[2]);
				R = Q * Diag * QT;
				R = L * R;

				if (R.Determinant() < 0)
				{
					R = ON_Xform(-1) * R;
					lambda = -1 * lambda;
				}
				R.Orthogonalize(ON_ZERO_TOLERANCE);  // tune it up - tol should be <= that in 
																							// Is_Rotation()
			}
		}
	}
	return rc;
}